

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall
QScrollerPrivate::createScrollingSegments
          (QScrollerPrivate *this,qreal v,qreal startPos,qreal deltaTime,qreal deltaPos,
          Orientation orientation)

{
  bool bVar1;
  int iVar2;
  QScrollerPropertiesPrivate *pQVar3;
  ulong uVar4;
  QDebug *pQVar5;
  double *pdVar6;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  QScrollerPrivate *this_00;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  qreal oStopProgress;
  qreal oDeltaTime_1;
  qreal stopProgress;
  qreal stopPos_1;
  qreal midPos;
  qreal pressDistance;
  qreal snapDistance;
  qreal higherSnapPos;
  qreal lowerSnapPos;
  qreal nextSnap;
  qreal oDeltaTime;
  qreal stopPos;
  qreal endPos;
  bool canOvershoot;
  bool noOvershoot;
  bool alwaysOvershoot;
  qreal viewSize;
  qreal maxPos;
  qreal minPos;
  OvershootPolicy policy;
  QScrollerPropertiesPrivate *sp;
  qreal oMaxDistance;
  qreal oDistance;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffbd8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  QMessageLogger *in_stack_fffffffffffffbf0;
  QDebug *in_stack_fffffffffffffbf8;
  qreal in_stack_fffffffffffffc00;
  QDebug *in_stack_fffffffffffffc08;
  QEasingCurve *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  ScrollType SVar14;
  QScrollerPrivate *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc58;
  qreal in_stack_fffffffffffffc60;
  QScrollerPrivate *in_stack_fffffffffffffc68;
  double local_378;
  double local_338;
  bool local_303;
  double local_2f8;
  double local_2c0;
  double local_2b8;
  double local_298;
  double local_288;
  double local_280;
  double local_278;
  OvershootPolicy local_26c;
  QDebug local_218;
  double local_210 [5];
  QDebug local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0 [5];
  QDebug local_198;
  double local_190;
  double local_188;
  double local_180 [5];
  QDebug local_158;
  QDebug local_150;
  QDebug local_148 [5];
  QDebug local_120 [5];
  QDebug local_f8 [5];
  QDebug local_d0;
  QDebug local_c8;
  QDebug local_c0 [5];
  QDebug local_98;
  double local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined1 *local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = in_XMM0_Qa;
  pQVar3 = QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
           ::data((QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
                   *)(in_RDI + 0x20));
  if (in_ESI == 1) {
    QList<QScrollerPrivate::ScrollSegment>::clear
              ((QList<QScrollerPrivate::ScrollSegment> *)in_stack_fffffffffffffbe0);
    local_26c = pQVar3->hOvershootPolicy;
    local_278 = QRectF::left((QRectF *)(in_RDI + 0x48));
    local_280 = QRectF::right((QRectF *)(in_RDI + 0x48));
    local_288 = QSizeF::width((QSizeF *)(in_RDI + 0x38));
  }
  else {
    QList<QScrollerPrivate::ScrollSegment>::clear
              ((QList<QScrollerPrivate::ScrollSegment> *)in_stack_fffffffffffffbe0);
    local_26c = pQVar3->vOvershootPolicy;
    local_278 = QRectF::top((QRectF *)(in_RDI + 0x48));
    local_280 = QRectF::bottom((QRectF *)(in_RDI + 0x48));
    local_288 = QSizeF::height((QSizeF *)(in_RDI + 0x38));
  }
  bVar1 = true;
  if (local_26c != OvershootAlwaysOff) {
    bVar1 = pQVar3->overshootScrollDistanceFactor == 0.0;
  }
  local_303 = false;
  if (!bVar1) {
    local_303 = local_26c == OvershootAlwaysOn || local_280 != 0.0;
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa87a31);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8,
               (char *)0xa87a4a);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,
                       (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    QDebug::~QDebug(&local_98);
    local_10 = 0;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = 0xaa;
  uStack_1f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa87b32);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8,
               (char *)0xa87b4b);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    pQVar5 = QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::QDebug(&local_c8,pQVar5);
    QEasingCurve::type();
    ::operator<<(in_stack_fffffffffffffc08,(Type)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    QDebug::~QDebug(local_c0);
    QDebug::~QDebug(&local_c8);
    QDebug::~QDebug(&local_d0);
    local_20 = 0;
  }
  local_298 = in_XMM1_Qa + in_XMM3_Qa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xaa;
  uStack_2f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_38);
    SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    if (!bVar1) break;
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa87c92);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8,
               (char *)0xa87cab);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::~QDebug(local_f8);
    local_30 = 0;
  }
  if (((in_XMM1_Qa < local_278) && (local_298 < local_278)) ||
     ((local_280 < in_XMM1_Qa && (local_280 < local_298)))) {
    QEasingCurve::type();
    pushSegment(in_stack_fffffffffffffc20,SVar14,(qreal)in_stack_fffffffffffffc10,
                (qreal)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (qreal)in_stack_fffffffffffffbf8,(qreal)in_stack_fffffffffffffbf0,
                (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                (Orientation)in_stack_fffffffffffffbe8);
    goto LAB_00a88e6d;
  }
  qVar7 = nextSnapPos(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                      (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                      (Orientation)in_stack_fffffffffffffc58);
  qVar8 = nextSnapPos(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                      (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                      (Orientation)in_stack_fffffffffffffc58);
  qVar9 = nextSnapPos(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                      (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                      (Orientation)in_stack_fffffffffffffc58);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa87f52);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8,
               (char *)0xa87f6b);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,
                       (char)((ulong)in_stack_fffffffffffffbd8 >> 0x38));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,
                       (char)((ulong)in_stack_fffffffffffffbd8 >> 0x38));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
    QDebug::~QDebug(local_120);
    local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
  }
  local_2c0 = qVar7;
  if ((qVar7 <= qVar9) && (uVar4 = qIsNaN(qVar9), (uVar4 & 1) == 0)) {
    local_2c0 = qVar9;
  }
  local_2b8 = qVar7;
  if ((qVar8 <= qVar7) && (uVar4 = qIsNaN(qVar8), (uVar4 & 1) == 0)) {
    local_2b8 = qVar8;
  }
  dVar10 = qAbs<double>(&local_90);
  if (dVar10 < pQVar3->minimumVelocity) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    lcScroller();
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_58);
      SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
      if (!bVar1) break;
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa880f0);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8,
                 (char *)0xa88109);
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
      QDebug::QDebug(&local_150,pQVar5);
      ::operator<<((QDebug *)in_stack_fffffffffffffbf0,
                   (Orientation)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      QDebug::~QDebug(local_148);
      QDebug::~QDebug(&local_150);
      QDebug::~QDebug(&local_158);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
    uVar4 = qIsNaN(qVar7);
    if ((uVar4 & 1) == 0) {
      if ((qVar7 != in_XMM1_Qa) || (NAN(qVar7) || NAN(in_XMM1_Qa))) {
        if (in_ESI == 1) {
          qVar7 = QPointF::x((QPointF *)(in_RDI + 0xb8));
          qVar8 = QPointF::x((QPointF *)(in_RDI + 0xa8));
          local_338 = qVar7 - qVar8;
        }
        else {
          qVar7 = QPointF::y((QPointF *)(in_RDI + 0xb8));
          qVar8 = QPointF::y((QPointF *)(in_RDI + 0xa8));
          local_338 = qVar7 - qVar8;
        }
        if ((pQVar3->snapPositionRatio != 0.0) || (NAN(pQVar3->snapPositionRatio))) {
          local_180[0] = local_338 / pQVar3->snapPositionRatio;
          qAbs<double>(local_180);
        }
        pushSegment(in_stack_fffffffffffffc20,SVar14,(qreal)in_stack_fffffffffffffc10,
                    (qreal)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (qreal)in_stack_fffffffffffffbf8,(qreal)in_stack_fffffffffffffbf0,
                    (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                    (Orientation)in_stack_fffffffffffffbe8);
        QEasingCurve::type();
        pushSegment(in_stack_fffffffffffffc20,SVar14,(qreal)in_stack_fffffffffffffc10,
                    (qreal)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (qreal)in_stack_fffffffffffffbf8,(qreal)in_stack_fffffffffffffbf0,
                    (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                    (Orientation)in_stack_fffffffffffffbe8);
      }
    }
    goto LAB_00a88e6d;
  }
  if (local_90 <= 0.0) {
LAB_00a8857e:
    if (local_90 < 0.0) {
      uVar4 = qIsNaN(local_2b8);
      SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
      if ((uVar4 & 1) == 0) {
        if ((local_298 - in_XMM1_Qa != 0.0) || (NAN(local_298 - in_XMM1_Qa))) {
          local_190 = (local_2b8 - in_XMM1_Qa) / (local_298 - in_XMM1_Qa);
          qAbs<double>(&local_190);
        }
        local_298 = local_2b8;
        goto LAB_00a88dea;
      }
    }
    SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    if ((local_298 < local_278) || (local_280 < local_298)) {
      if (local_278 <= local_298) {
        local_378 = local_280;
      }
      else {
        local_378 = local_278;
      }
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      lcScroller();
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_68);
        SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
        if (!bVar1) break;
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa88730);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                   (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(char *)in_stack_fffffffffffffbd8
                   ,(char *)0xa88749);
        QMessageLogger::debug();
        QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
        QDebug::~QDebug(&local_198);
        local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
      }
      if (local_303) {
        local_1c0[0] = (local_378 - in_XMM1_Qa) / in_XMM3_Qa;
        qAbs<double>(local_1c0);
        qVar7 = progressForValue(in_stack_fffffffffffffc10,(qreal)in_stack_fffffffffffffc08);
        dVar10 = pQVar3->overshootScrollTime;
        local_1c8 = qVar7 + (dVar10 * 0.3) / in_XMM2_Qa;
        local_1d0 = 1.0;
        pdVar6 = qMin<double>(&local_1c8,&local_1d0);
        local_2f8 = *pdVar6;
        dVar12 = in_XMM1_Qa;
        dVar13 = in_XMM3_Qa;
        dVar11 = (double)QEasingCurve::valueForProgress(local_2f8);
        local_1d8 = (dVar13 * dVar11 + dVar12) - local_378;
        iVar2 = qSign(local_1d8);
        local_1e0 = (double)iVar2 * local_288 * pQVar3->overshootScrollDistanceFactor;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        lcScroller();
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_78), bVar1) {
          anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa88a1f);
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                     (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                     (char *)in_stack_fffffffffffffbd8,(char *)0xa88a38);
          QMessageLogger::debug();
          QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
          QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
          QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
          QDebug::~QDebug(&local_1e8);
          local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
        }
        dVar12 = qAbs<double>(&local_1d8);
        dVar13 = qAbs<double>(&local_1e0);
        if (dVar13 < dVar12) {
          local_210[0] = ((local_378 + local_1e0) - in_XMM1_Qa) / in_XMM3_Qa;
          qAbs<double>(local_210);
          local_2f8 = progressForValue(in_stack_fffffffffffffc10,(qreal)in_stack_fffffffffffffc08);
          local_1d8 = local_1e0;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          lcScroller();
          anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
            anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa88bd6);
            QMessageLogger::QMessageLogger
                      (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                       (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                       (char *)in_stack_fffffffffffffbd8,(char *)0xa88bef);
            QMessageLogger::debug();
            QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8
                              );
            QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8
                              );
            QDebug::operator<<(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc28);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8
                              );
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8
                              );
            QDebug::~QDebug(&local_218);
            local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
          }
        }
        SVar14 = (ScrollType)((ulong)(local_378 + local_1d8) >> 0x20);
        QEasingCurve::type();
        pushSegment(in_stack_fffffffffffffc20,SVar14,in_XMM3_Qa,in_XMM1_Qa,local_2f8,in_XMM2_Qa,
                    (qreal)in_stack_fffffffffffffbf0,
                    (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                    (Orientation)in_stack_fffffffffffffbe8);
        this_00 = (QScrollerPrivate *)(dVar10 * 0.7);
        QEasingCurve::type();
        pushSegment(this_00,SVar14,in_XMM3_Qa,in_XMM1_Qa,local_2f8,in_XMM2_Qa,
                    (qreal)in_stack_fffffffffffffbf0,
                    (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                    (Orientation)in_stack_fffffffffffffbe8);
      }
      else {
        QEasingCurve::type();
        pushSegment(in_stack_fffffffffffffc20,SVar14,(qreal)in_stack_fffffffffffffc10,
                    (qreal)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (qreal)in_stack_fffffffffffffbf8,(qreal)in_stack_fffffffffffffbf0,
                    (Type)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                    (Orientation)in_stack_fffffffffffffbe8);
      }
      goto LAB_00a88e6d;
    }
  }
  else {
    uVar4 = qIsNaN(local_2c0);
    SVar14 = (ScrollType)((ulong)in_stack_fffffffffffffc18 >> 0x20);
    if ((uVar4 & 1) != 0) goto LAB_00a8857e;
    if ((local_298 - in_XMM1_Qa != 0.0) || (NAN(local_298 - in_XMM1_Qa))) {
      local_188 = (local_2c0 - in_XMM1_Qa) / (local_298 - in_XMM1_Qa);
      qAbs<double>(&local_188);
    }
    local_298 = local_2c0;
  }
LAB_00a88dea:
  QEasingCurve::type();
  pushSegment(in_stack_fffffffffffffc20,SVar14,(qreal)in_stack_fffffffffffffc10,
              (qreal)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
              (qreal)in_stack_fffffffffffffbf8,local_298,(Type)((ulong)in_XMM3_Qa >> 0x20),
              SUB84(in_XMM3_Qa,0));
LAB_00a88e6d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::createScrollingSegments(qreal v, qreal startPos,
                                               qreal deltaTime, qreal deltaPos,
                                               Qt::Orientation orientation)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QScrollerProperties::OvershootPolicy policy;
    qreal minPos;
    qreal maxPos;
    qreal viewSize;

    if (orientation == Qt::Horizontal) {
        xSegments.clear();
        policy = sp->hOvershootPolicy;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
        viewSize = viewportSize.width();
    } else {
        ySegments.clear();
        policy = sp->vOvershootPolicy;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
        viewSize = viewportSize.height();
    }

    bool alwaysOvershoot = (policy == QScrollerProperties::OvershootAlwaysOn);
    bool noOvershoot = (policy == QScrollerProperties::OvershootAlwaysOff) || !sp->overshootScrollDistanceFactor;
    bool canOvershoot = !noOvershoot && (alwaysOvershoot || maxPos);

    qCDebug(lcScroller) << "+++ createScrollingSegments: s:" << startPos << "maxPos:" << maxPos
                        << "o:" << int(orientation);

    qCDebug(lcScroller) << "v = " << v << ", decelerationFactor = " << sp->decelerationFactor
                        << ", curveType = " << sp->scrollingCurve.type();

    qreal endPos = startPos + deltaPos;

    qCDebug(lcScroller) << "  Real Delta:" << deltaPos;

    // -- check if are in overshoot and end in overshoot
    if ((startPos < minPos && endPos < minPos) ||
        (startPos > maxPos && endPos > maxPos)) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;
        qreal oDeltaTime = sp->overshootScrollTime;

        pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0), startPos,
                    stopPos - startPos, stopPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // -- determine snap points
    qreal nextSnap = nextSnapPos(endPos, 0, orientation);
    qreal lowerSnapPos = nextSnapPos(startPos, -1, orientation);
    qreal higherSnapPos = nextSnapPos(startPos, 1, orientation);

    qCDebug(lcScroller) << "  Real Delta:" << lowerSnapPos << '-' << nextSnap << '-' <<higherSnapPos;

    // - check if we can reach another snap point
    if (nextSnap > higherSnapPos || qIsNaN(higherSnapPos))
        higherSnapPos = nextSnap;
    if (nextSnap < lowerSnapPos || qIsNaN(lowerSnapPos))
        lowerSnapPos = nextSnap;

    if (qAbs(v) < sp->minimumVelocity) {

        qCDebug(lcScroller) << "### below minimum Vel" << orientation;

        // - no snap points or already at one
        if (qIsNaN(nextSnap) || nextSnap == startPos)
            return; // nothing to do, no scrolling needed.

        // - decide which point to use

        qreal snapDistance = higherSnapPos - lowerSnapPos;

        qreal pressDistance = (orientation == Qt::Horizontal) ?
            lastPosition.x() - pressPosition.x() :
            lastPosition.y() - pressPosition.y();

        // if not dragged far enough, pick the next snap point.
        if (sp->snapPositionRatio == 0.0 || qAbs(pressDistance / sp->snapPositionRatio) > snapDistance)
            endPos = nextSnap;
        else if (pressDistance < 0.0)
            endPos = lowerSnapPos;
        else
            endPos = higherSnapPos;

        deltaPos = endPos - startPos;
        qreal midPos = startPos + deltaPos * qreal(0.3);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.3), qreal(1.0), startPos,
                    midPos - startPos, midPos, QEasingCurve::InQuad, orientation);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.7), qreal(1.0), midPos,
                    endPos - midPos, endPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // - go to the next snappoint if there is one
    if (v > 0 && !qIsNaN(higherSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((higherSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = higherSnapPos;

    } else if (v < 0 && !qIsNaN(lowerSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((lowerSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = lowerSnapPos;

    // -- check if we are overshooting
    } else if (endPos < minPos || endPos > maxPos) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;

        qCDebug(lcScroller) << "Overshoot: delta:" << (stopPos - startPos);

        if (!canOvershoot) {
            pushSegment(ScrollTypeFlick, deltaTime, qreal(1), startPos, deltaPos, stopPos,
                        sp->scrollingCurve.type(), orientation);
        } else {
            qreal stopProgress = progressForValue(sp->scrollingCurve, qAbs((stopPos - startPos) / deltaPos));
            qreal oDeltaTime = sp->overshootScrollTime;
            qreal oStopProgress = qMin(stopProgress + oDeltaTime * qreal(0.3) / deltaTime, qreal(1));
            qreal oDistance = startPos + deltaPos * sp->scrollingCurve.valueForProgress(oStopProgress) - stopPos;
            qreal oMaxDistance = qSign(oDistance) * (viewSize * sp->overshootScrollDistanceFactor);

            qCDebug(lcScroller) << "1 oDistance:" << oDistance << "Max:" << oMaxDistance
                                << "stopP/oStopP" << stopProgress << oStopProgress;

            if (qAbs(oDistance) > qAbs(oMaxDistance)) {
                oStopProgress = progressForValue(sp->scrollingCurve,
                                                 qAbs((stopPos + oMaxDistance - startPos) / deltaPos));
                oDistance = oMaxDistance;
                qCDebug(lcScroller) << "2 oDistance:" << oDistance << "Max:" << oMaxDistance
                                    << "stopP/oStopP" << stopProgress << oStopProgress;
            }

            pushSegment(ScrollTypeFlick, deltaTime, oStopProgress, startPos, deltaPos,
                        stopPos + oDistance, sp->scrollingCurve.type(), orientation);
            pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0),
                        stopPos + oDistance, -oDistance, stopPos, sp->scrollingCurve.type(),
                        orientation);
        }
        return;
    }

    pushSegment(ScrollTypeFlick, deltaTime, qreal(1.0), startPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}